

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

bool __thiscall
testing::internal::
TypedExpectation<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
::Matches(TypedExpectation<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
          *this,ArgumentTuple *args)

{
  bool bVar1;
  bool local_19;
  ArgumentTuple *args_local;
  TypedExpectation<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
  *this_local;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  bVar1 = TupleMatches<std::tuple<testing::Matcher<ot::commissioner::ActiveOperationalDataset&>,testing::Matcher<unsigned_short>>,std::tuple<ot::commissioner::ActiveOperationalDataset&,unsigned_short>>
                    (&this->matchers_,args);
  local_19 = false;
  if (bVar1) {
    local_19 = MatcherBase<const_std::tuple<ot::commissioner::ActiveOperationalDataset_&,_unsigned_short>_&>
               ::Matches(&(this->extra_matcher_).
                          super_MatcherBase<const_std::tuple<ot::commissioner::ActiveOperationalDataset_&,_unsigned_short>_&>
                         ,args);
  }
  return local_19;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }